

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int test_miniz(uchar *s_pStr,uLong data_len)

{
  int iVar1;
  uchar *pDest;
  uchar *pDest_00;
  uint8_t *pUncomp;
  uint8_t *pCmp;
  uLong uncomp_len;
  uLong cmp_len;
  uLong src_len;
  uLong uStack_20;
  int cmp_status;
  uLong data_len_local;
  uchar *s_pStr_local;
  
  cmp_len = data_len;
  uStack_20 = data_len;
  data_len_local = (uLong)s_pStr;
  uncomp_len = mz_compressBound(data_len);
  pCmp = (uint8_t *)cmp_len;
  printf("miniz.c version: %s\n","10.0.2");
  pDest = (uchar *)malloc(uncomp_len);
  pDest_00 = (uchar *)malloc(cmp_len);
  if ((pDest == (uchar *)0x0) || (pDest_00 == (uchar *)0x0)) {
    printf("Out of memory!\n");
  }
  else {
    src_len._4_4_ = mz_compress(pDest,&uncomp_len,(uchar *)data_len_local,cmp_len);
    if (src_len._4_4_ == 0) {
      printf("Compressed from %u to %u bytes\n",cmp_len & 0xffffffff,uncomp_len & 0xffffffff);
      src_len._4_4_ = mz_uncompress(pDest_00,(mz_ulong *)&pCmp,pDest,uncomp_len);
      if (src_len._4_4_ == 0) {
        printf("Decompressed from %u to %u bytes\n",uncomp_len & 0xffffffff,(ulong)pCmp & 0xffffffff
              );
        if ((pCmp == (uint8_t *)cmp_len) &&
           (iVar1 = memcmp(pDest_00,(void *)data_len_local,cmp_len), iVar1 == 0)) {
          free(pDest);
          free(pDest_00);
          printf("Success.\n");
          return 0;
        }
        printf("Decompression failed!\n");
        free(pDest);
        free(pDest_00);
      }
      else {
        printf("uncompress failed!\n");
        free(pDest);
        free(pDest_00);
      }
    }
    else {
      printf("compress() failed!\n");
      free(pDest);
      free(pDest_00);
    }
  }
  return 1;
}

Assistant:

int test_miniz(const unsigned char *s_pStr, uLong data_len) {
    int cmp_status;
    uLong src_len = data_len;
    uLong cmp_len = compressBound(src_len);
    uLong uncomp_len = src_len;
    uint8_t *pCmp, *pUncomp;
    printf("miniz.c version: %s\n", MZ_VERSION);
    // Allocate buffers to hold compressed and uncompressed data.
    pCmp = (mz_uint8 *) malloc((size_t) cmp_len);
    pUncomp = (mz_uint8 *) malloc((size_t) src_len);
    if ((!pCmp) || (!pUncomp)) {
        printf("Out of memory!\n");
        return EXIT_FAILURE;
    }
    // Compress the string.
    cmp_status = compress(pCmp, &cmp_len, (const unsigned char *) s_pStr, src_len);
    if (cmp_status != Z_OK) {
        printf("compress() failed!\n");
        free(pCmp);
        free(pUncomp);
        return EXIT_FAILURE;
    }
    printf("Compressed from %u to %u bytes\n", (mz_uint32) src_len, (mz_uint32) cmp_len);
    // Decompress.
    cmp_status = uncompress(pUncomp, &uncomp_len, pCmp, cmp_len);
    if (cmp_status != Z_OK) {
        printf("uncompress failed!\n");
        free(pCmp);
        free(pUncomp);
        return EXIT_FAILURE;
    }
    printf("Decompressed from %u to %u bytes\n", (mz_uint32) cmp_len, (mz_uint32) uncomp_len);
    // Ensure uncompress() returned the expected data.
    if ((uncomp_len != src_len) || (memcmp(pUncomp, s_pStr, (size_t) src_len))) {
        printf("Decompression failed!\n");
        free(pCmp);
        free(pUncomp);
        return EXIT_FAILURE;
    }
    free(pCmp);
    free(pUncomp);
    printf("Success.\n");
    return EXIT_SUCCESS;

}